

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O3

int gzip_bidder_init(archive_read_filter *self)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  
  self->code = 1;
  self->name = "gzip";
  __ptr = calloc(1,0xb0);
  __ptr_00 = malloc(0x10000);
  if (__ptr == (void *)0x0 || __ptr_00 == (void *)0x0) {
    free(__ptr_00);
    free(__ptr);
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for gzip decompression");
    iVar1 = -0x1e;
  }
  else {
    self->data = __ptr;
    *(undefined8 *)((long)__ptr + 0x80) = 0x10000;
    *(void **)((long)__ptr + 0x78) = __ptr_00;
    self->vtable = &gzip_reader_vtable;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
gzip_bidder_init(struct archive_read_filter *self)
{
	struct private_data *state;
	static const size_t out_block_size = 64 * 1024;
	void *out_block;

	self->code = ARCHIVE_FILTER_GZIP;
	self->name = "gzip";

	state = calloc(1, sizeof(*state));
	out_block = malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		free(out_block);
		free(state);
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for gzip decompression");
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->vtable = &gzip_reader_vtable;

	state->in_stream = 0; /* We're not actually within a stream yet. */

	return (ARCHIVE_OK);
}